

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

bool __thiscall
libchars::command_cursor::find(command_cursor *this,string *search,filter_t mask,bool ignore_hidden)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  command_node *pcVar4;
  char *pcVar5;
  size_t sVar6;
  _Elt_pointer ppcVar7;
  undefined7 in_register_00000009;
  command_node **__x;
  ulong uVar8;
  command_node *local_50;
  command_node *n;
  filter_t local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,ignore_hidden);
  if (search->_M_string_length == 0) {
    return false;
  }
  n = (command_node *)&this->w;
  uVar8 = 0;
  local_40 = mask;
  do {
    while( true ) {
      pcVar4 = current(this);
      if ((pcVar4 == (command_node *)0x0) || (search->_M_string_length <= uVar8)) {
        pcVar4 = current(this);
        if (pcVar4 == (command_node *)0x0) {
          return false;
        }
        if (search->_M_string_length <= uVar8) {
          pcVar4 = current(this);
          if ((pcVar4->mask & local_40) == 0) {
            return false;
          }
          pcVar4 = current(this);
          return (bool)(pcVar4->hidden ^ 1U | (byte)local_34);
        }
        return false;
      }
      pcVar5 = (char *)std::__cxx11::string::at((ulong)search);
      cVar1 = *pcVar5;
      uVar2 = this->idx;
      sVar6 = current_length(this);
      if (uVar2 < sVar6) break;
      pcVar4 = current(this);
      if (pcVar4->head == (command_node *)0x0) {
        return false;
      }
      pcVar4 = current(this);
      if ((pcVar4->mask & local_40) == 0) {
        return false;
      }
      pcVar4 = current(this);
      if ((byte)(pcVar4->hidden ^ 1U | (byte)local_34) != 1) {
        return false;
      }
      pcVar4 = current(this);
      __x = &pcVar4->head;
LAB_0010f656:
      std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::push_back
                ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)this,
                 __x);
      this->idx = 0;
    }
    cVar3 = current_char(this);
    if (((cVar1 != cVar3) || (pcVar4 = current(this), (pcVar4->mask & local_40) == 0)) ||
       ((pcVar4 = current(this), pcVar4->hidden == true && ((byte)local_34 == '\0')))) {
      if (this->idx != 0) {
        return false;
      }
      ppcVar7 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppcVar7 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        return false;
      }
      if (ppcVar7 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppcVar7 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_50 = ppcVar7[-1]->next;
      if (local_50 == (command_node *)0x0) {
        return false;
      }
      std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)this)
      ;
      __x = &local_50;
      goto LAB_0010f656;
    }
    uVar8 = uVar8 + 1;
    this->idx = this->idx + 1;
    std::__cxx11::string::push_back((char)n);
  } while( true );
}

Assistant:

bool command_cursor::find(const std::string &search, command::filter_t mask, bool ignore_hidden)
    {
        if (search.empty())
            return false;

        size_t si = 0; // index into search (0..length)

        while (current() != NULL && si < search.length()) {
            char c = search.at(si);

            if (idx >= current_length()) {
                if (current()->head != NULL && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                    S.push(current()->head);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else if (c == current_char() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                ++si;
                ++idx;
                w += c;
            }
            else if (idx == 0) {
                if (S.empty()) {
                    return false;
                }
                command_node *n = S.top()->next;
                if (n != NULL) {
                    S.pop();
                    S.push(n);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else {
                return false;
            }
        }

        return (current() != NULL && si >= search.length() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden));
    }